

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::MultDivideMod(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  allocator<char> local_49;
  string local_48;
  
  requireDStackDepth(this,3,"*/MOD");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  if (uVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"*/: zero divisor",&local_49);
    throwCppExceptionMessage(this,&local_48,errorDivisionByZero);
    std::__cxx11::string::~string((string *)&local_48);
  }
  uVar3 = ForthStack<unsigned_int>::getTop(this_00,1);
  ForthStack<unsigned_int>::setTop
            (this_00,1,(uint)(((long)(int)uVar3 * (long)(int)uVar2) % (long)(int)uVar1));
  ForthStack<unsigned_int>::setTop
            (this_00,0,(uint)(((long)(int)uVar3 * (long)(int)uVar2) / (long)(int)uVar1));
  return;
}

Assistant:

void MultDivideMod(){
			REQUIRE_DSTACK_DEPTH(3, "*/MOD");
			SDCell n3(static_cast<SCell>(dStack.getTop())); dStack.pop();
			SDCell n2(static_cast<SCell>(dStack.getTop())); 
			RUNTIME_ERROR_IF(n3.data_.Cells.lo == 0, "*/: zero divisor", errorDivisionByZero);
			SDCell n1(static_cast<SCell>( dStack.getTop(1)));
			SDCell quotent( (n1.data_.Dcells*n2.data_.Dcells) / n3.data_.Dcells );
			SDCell reminder( (n1.data_.Dcells*n2.data_.Dcells) % n3.data_.Dcells );
			dStack.setTop(1, reminder.data_.Cells.lo);
			dStack.setTop(0, quotent.data_.Cells.lo);
		}